

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# updaterevision.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  char vertag [128];
  char lastlog [128];
  char lasthash [128];
  
  vertag._0_8_ = vertag._0_8_ & 0xffffffffffffff00;
  lastlog._0_2_ = lastlog._0_2_ & 0xff00;
  if (argc == 2) {
    pFVar3 = popen("git describe --tags && git log -1 --format=%ai*%H","r");
    bVar1 = true;
    if (pFVar3 == (FILE *)0x0) {
LAB_001012df:
      pFVar3 = _stderr;
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      fprintf(pFVar3,"Failed to get commit info: %s\n",pcVar4);
      builtin_strncpy(vertag,"<unknown version>",0x12);
      pcVar4 = lastlog;
      lastlog[0] = '\0';
      lastlog[1] = '0';
      lastlog[2] = '\0';
    }
    else {
      pcVar4 = fgets(vertag,0x80,pFVar3);
      if ((pcVar4 != vertag) || (pcVar4 = fgets(lastlog,0x80,pFVar3), pcVar4 != lastlog)) {
        pclose(pFVar3);
        goto LAB_001012df;
      }
      stripnl(vertag);
      stripnl(lastlog);
      pclose(pFVar3);
      pcVar4 = strchr(lastlog,0x2a);
      if (pcVar4 == (char *)0x0) {
        bVar1 = false;
        goto LAB_001012df;
      }
      *pcVar4 = '\0';
      bVar1 = false;
    }
    pcVar4 = pcVar4 + 1;
    pFVar3 = fopen(argv[1],"r");
    if (pFVar3 == (FILE *)0x0) {
LAB_001013aa:
      pFVar3 = fopen(argv[1],"w");
      if (pFVar3 == (FILE *)0x0) goto LAB_001013bf;
      fprintf(pFVar3,
              "// %s\n//\n// This file was automatically generated by the\n// updaterevision tool. Do not edit by hand.\n\n#define GIT_DESCRIPTION \"%s\"\n#define GIT_HASH \"%s\"\n#define GIT_TIME \"%s\"\n"
              ,pcVar4,vertag,pcVar4,lastlog);
      fclose(pFVar3);
      pcVar4 = argv[1];
      pcVar6 = "%s updated to commit %s.\n";
    }
    else {
      if (bVar1) {
        fclose(pFVar3);
        return 0;
      }
      pcVar6 = fgets(lasthash,0x80,pFVar3);
      if (pcVar6 != lasthash) {
        fclose(pFVar3);
        goto LAB_001013aa;
      }
      stripnl(lasthash);
      iVar2 = strcmp(pcVar4,lasthash + 3);
      fclose(pFVar3);
      if (iVar2 != 0) goto LAB_001013aa;
      pcVar4 = argv[1];
      pcVar6 = "%s is up to date at commit %s.\n";
    }
    iVar2 = 0;
    fprintf(_stderr,pcVar6,pcVar4,vertag);
  }
  else {
    fprintf(_stderr,"Usage: %s <path to gitinfo.h>\n",*argv);
LAB_001013bf:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
	char vertag[128], lastlog[128], lasthash[128], *hash = NULL;
	FILE *stream = NULL;
	int gotrev = 0, needupdate = 1;

	vertag[0] = '\0';
	lastlog[0] = '\0';

	if (argc != 2)
	{
		fprintf(stderr, "Usage: %s <path to gitinfo.h>\n", argv[0]);
		return 1;
	}

	// Use git describe --tags to get a version string. If we are sitting directly
	// on a tag, it returns that tag. Otherwise it returns <most recent tag>-<number of
	// commits since the tag>-<short hash>.
	// Use git log to get the time of the latest commit in ISO 8601 format and its full hash.
	stream = popen("git describe --tags && git log -1 --format=%ai*%H", "r");

	if (NULL != stream)
	{
		if (fgets(vertag, sizeof vertag, stream) == vertag &&
			fgets(lastlog, sizeof lastlog, stream) == lastlog)
		{
			stripnl(vertag);
			stripnl(lastlog);
			gotrev = 1;
		}

		pclose(stream);
	}

	if (gotrev)
	{
		hash = strchr(lastlog, '*');
		if (hash != NULL)
		{
			*hash = '\0';
			hash++;
		}
	}
	if (hash == NULL)
	{
		fprintf(stderr, "Failed to get commit info: %s\n", strerror(errno));
		strcpy(vertag, "<unknown version>");
		lastlog[0] = '\0';
		lastlog[1] = '0';
		lastlog[2] = '\0';
		hash = lastlog + 1;
	}

	stream = fopen (argv[1], "r");
	if (stream != NULL)
	{
		if (!gotrev)
		{ // If we didn't get a revision but the file does exist, leave it alone.
			fclose (stream);
			return 0;
		}
		// Read the revision that's in this file already. If it's the same as
		// what we've got, then we don't need to modify it and can avoid rebuilding
		// dependant files.
		if (fgets(lasthash, sizeof lasthash, stream) == lasthash)
		{
			stripnl(lasthash);
			if (strcmp(hash, lasthash + 3) == 0)
			{
				needupdate = 0;
			}
		}
		fclose (stream);
	}

	if (needupdate)
	{
		stream = fopen (argv[1], "w");
		if (stream == NULL)
		{
			return 1;
		}
		fprintf(stream,
"// %s\n"
"//\n"
"// This file was automatically generated by the\n"
"// updaterevision tool. Do not edit by hand.\n"
"\n"
"#define GIT_DESCRIPTION \"%s\"\n"
"#define GIT_HASH \"%s\"\n"
"#define GIT_TIME \"%s\"\n",
			hash, vertag, hash, lastlog);
		fclose(stream);
		fprintf(stderr, "%s updated to commit %s.\n", argv[1], vertag);
	}
	else
	{
		fprintf (stderr, "%s is up to date at commit %s.\n", argv[1], vertag);
	}

	return 0;
}